

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

Block * __thiscall Js::CompoundString::BlockInfo::Resize(BlockInfo *this,Recycler *recycler)

{
  Block *pBVar1;
  void *address;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  CharCount CVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Recycler *this_00;
  char16 *dst;
  Block *pBVar8;
  uint charCapacity;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x191,"(recycler)","recycler");
    if (!bVar3) goto LAB_00b37d96;
    *puVar7 = 0;
  }
  uVar4 = this->charLength + (uint)(this->charLength == 0);
  charCapacity = uVar4 + 7 & 0xfffffff8;
  if (charCapacity < uVar4) {
    ::Math::DefaultOverflowPolicy();
  }
  CVar5 = GrowCharCapacity(charCapacity);
  bVar3 = ShouldAllocateBuffer(CVar5);
  if (bVar3) {
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_6104351;
    data.filename._0_4_ = 0x196;
    data.plusSize = (ulong)CVar5;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    if (CVar5 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      dst = (char16 *)&DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b37d96;
        *puVar7 = 0;
      }
      dst = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this_00,(ulong)CVar5 * 2);
      if (dst == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00b37d96:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
    this->charCapacity = CVar5;
    uVar4 = this->charLength;
    CVar5 = Block::PointerLengthFromCharLength(CVar5);
    Memory::Recycler::WBSetBitRange((char *)dst,CVar5);
    js_wmemcpy_s(dst,(ulong)this->charCapacity,(char16 *)(this->buffer).ptr,(ulong)uVar4);
    Memory::Recycler::WBSetBit((char *)this);
    (this->buffer).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    address = (this->buffer).ptr;
    CVar5 = Block::PointerLengthFromCharLength(this->charLength);
    Memory::RecyclerWriteBarrierManager::WriteBarrier(address,(ulong)CVar5 << 3);
    pBVar8 = (Block *)0x0;
  }
  else {
    pBVar8 = Block::New((this->buffer).ptr,this->charLength,true,recycler);
    pBVar1 = (pBVar8->bufferOwner).ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buffer).ptr = pBVar1 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    this->charLength = pBVar8->charLength;
    this->charCapacity = pBVar8->charCapacity;
  }
  return pBVar8;
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::Resize(Recycler *const recycler)
    {
        Assert(recycler);

        const CharCount newCharCapacity = GrowCharCapacity(AlignCharCapacityForAllocation(CharLength()));
        if(ShouldAllocateBuffer(newCharCapacity))
        {
            void *const newBuffer = RecyclerNewArray(recycler, char16, newCharCapacity);
            charCapacity = newCharCapacity;
            const CharCount charLength = CharLength();

            ArrayWriteBarrierVerifyBits(Block::Pointers(newBuffer), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s((char16*)newBuffer, charCapacity, (char16*)PointerValue(buffer), charLength);
            buffer = newBuffer;
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, CharLength(), true, recycler);
        CopyFrom(block);
        return block;
    }